

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O0

void __thiscall
OpenMD::StuntDouble::StuntDouble(StuntDouble *this,ObjectType objType,DataStoragePointer storage)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__StuntDouble_00509398;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  in_RDI[2] = in_RDX;
  in_RDI[3] = 0;
  *(undefined1 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0xffffffff;
  *(undefined4 *)(in_RDI + 5) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 6) = 0xffffffff;
  PropertyMap::PropertyMap((PropertyMap *)0x287af4);
  return;
}

Assistant:

StuntDouble::StuntDouble(ObjectType objType, DataStoragePointer storage) :
      objType_(objType), storage_(storage), snapshotMan_(NULL), linear_(false),
      linearAxis_(-1), globalIndex_(-1), globalIntegrableObjectIndex_(-1),
      localIndex_(-1) {}